

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void __thiscall
HTTPWorkItem::HTTPWorkItem
          (HTTPWorkItem *this,unique_ptr<HTTPRequest,_std::default_delete<HTTPRequest>_> _req,
          string *_path,HTTPRequestHandler *_func)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_HTTPClosure)._vptr_HTTPClosure = (_func_int **)&PTR_operator___0114fa18;
  (this->req)._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
  super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
  super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl =
       *(HTTPRequest **)
        _req._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
        super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
        super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl;
  *(undefined8 *)
   _req._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
   super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
   super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl = 0;
  std::__cxx11::string::string((string *)&this->path,_path);
  std::
  function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->func,_func);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

HTTPWorkItem(std::unique_ptr<HTTPRequest> _req, const std::string &_path, const HTTPRequestHandler& _func):
        req(std::move(_req)), path(_path), func(_func)
    {
    }